

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_malloc.cpp
# Opt level: O1

void * Omega_h::host_malloc(size_t size)

{
  long *plVar1;
  undefined8 *puVar2;
  void *pvVar3;
  ulong *puVar4;
  ulong uVar5;
  ScopedTimer omega_h_scoped_function_timer;
  string __str;
  ScopedTimer local_a1;
  long *local_a0;
  undefined8 local_98;
  long local_90;
  undefined8 uStack_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  ulong *local_60;
  long local_58;
  ulong local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_malloc.cpp"
             ,"");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_40);
  puVar4 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar4) {
    local_50 = *puVar4;
    lStack_48 = plVar1[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *puVar4;
    local_60 = (ulong *)*plVar1;
  }
  local_58 = plVar1[1];
  *plVar1 = (long)puVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_80 = local_70;
  std::__cxx11::string::_M_construct((ulong)&local_80,'\x02');
  *(undefined2 *)local_80 = 0x3533;
  uVar5 = 0xf;
  if (local_60 != &local_50) {
    uVar5 = local_50;
  }
  if (uVar5 < (ulong)(local_78 + local_58)) {
    uVar5 = 0xf;
    if (local_80 != local_70) {
      uVar5 = local_70[0];
    }
    if ((ulong)(local_78 + local_58) <= uVar5) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_60);
      goto LAB_002f8086;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80);
LAB_002f8086:
  local_a0 = &local_90;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_90 = *plVar1;
    uStack_88 = puVar2[3];
  }
  else {
    local_90 = *plVar1;
    local_a0 = (long *)*puVar2;
  }
  local_98 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  begin_code("host_malloc",(char *)local_a0);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  pvVar3 = malloc(size);
  ScopedTimer::~ScopedTimer(&local_a1);
  return pvVar3;
}

Assistant:

void* host_malloc(std::size_t size) {
  OMEGA_H_TIME_FUNCTION;
#ifdef OMEGA_H_USE_CUDA
  void* tmp_ptr;
  auto cuda_malloc_size = size;
  if (cuda_malloc_size < 1) cuda_malloc_size = 1;
  auto const err = cudaMallocHost(&tmp_ptr, cuda_malloc_size);
  if (err == cudaErrorMemoryAllocation) return nullptr;
  OMEGA_H_CHECK(err == cudaSuccess);
  return tmp_ptr;
#else
  return ::std::malloc(size);
#endif
}